

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void charevnt_hero_release(tgestate_t *state,route_t *route)

{
  tgestate_t *in_RSI;
  long in_RDI;
  route_t *in_stack_ffffffffffffffe8;
  
  *(undefined1 *)&in_RSI->width = 0xa4;
  *(undefined1 *)((long)&in_RSI->width + 1) = 3;
  *(undefined1 *)(in_RDI + 0x6f0) = 0;
  set_hero_route_force(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void charevnt_hero_release(tgestate_t *state, route_t *route)
{
  /* Reverse the commandant's route. */
  route->index = routeindex_36_GO_TO_SOLITARY | ROUTEINDEX_REVERSE_FLAG;
  route->step  = 3;

  state->automatic_player_counter = 0; /* Force automatic control */

  {
    static const route_t route_37 = { routeindex_37_HERO_LEAVE_SOLITARY, 0 }; /* was BC */
    set_hero_route_force(state, &route_37);
  }
}